

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTableBuilderVisitor.cpp
# Opt level: O3

void __thiscall
hdc::SymbolTableBuilderVisitor::visit(SymbolTableBuilderVisitor *this,AtExpression *expression)

{
  int iVar1;
  IdentifierExpression *this_00;
  Symbol *value;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string name;
  string local_68;
  string local_48;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  this_00 = (IdentifierExpression *)UnaryOperator::getExpression(&expression->super_UnaryOperator);
  IdentifierExpression::getName_abi_cxx11_(&local_48,this_00);
  std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  value = SymbolTable::hasClassVariable(this->symbolTable,&local_68);
  if (value != (Symbol *)0x0) {
    IdentifierExpression::setSymbol(this_00,value);
    pTVar2 = Symbol::getType(value);
    iVar1 = (*(pTVar2->super_ASTNode)._vptr_ASTNode[3])(pTVar2);
    Expression::setType((Expression *)this_00,(Type *)CONCAT44(extraout_var,iVar1));
    pTVar2 = Expression::getType((Expression *)this_00);
    this->lastType = pTVar2;
    if (pTVar2 != (Type *)0x0) {
      (**(pTVar2->super_ASTNode)._vptr_ASTNode)(pTVar2,this);
    }
  }
  iVar1 = (*(this->lastType->super_ASTNode)._vptr_ASTNode[3])();
  Expression::setType((Expression *)expression,(Type *)CONCAT44(extraout_var_00,iVar1));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SymbolTableBuilderVisitor::visit(AtExpression* expression) {
    Symbol* symbol;
    IdentifierExpression* id;
    std::string name;
    Variable* v;

    id = (IdentifierExpression*) expression->getExpression();
    name = id->getName();
    symbol = symbolTable->hasClassVariable(name);

    if (symbol != nullptr) {
        id->setSymbol(symbol);
        id->setType(symbol->getType()->clone());
        setLastType(id->getType());
    }

    expression->setType(lastType->clone());
}